

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

int __thiscall DmgFactors::Apply(DmgFactors *this,FName *type,int damage)

{
  bool bVar1;
  FName local_38;
  FName local_34;
  double *local_30;
  double *pdf;
  FName *pFStack_20;
  int damage_local;
  FName *type_local;
  DmgFactors *this_local;
  
  pdf._4_4_ = damage;
  pFStack_20 = type;
  type_local = (FName *)this;
  FName::FName(&local_34,type);
  local_30 = TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::CheckKey
                       (&this->super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>,
                        &local_34);
  if ((local_30 == (double *)0x0) && (bVar1 = FName::operator!=(type,NAME_None), bVar1)) {
    FName::FName(&local_38,NAME_None);
    local_30 = TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::CheckKey
                         (&this->
                           super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>,
                          &local_38);
  }
  if (local_30 == (double *)0x0) {
    this_local._4_4_ = pdf._4_4_;
  }
  else {
    this_local._4_4_ = (int)((double)pdf._4_4_ * *local_30);
  }
  return this_local._4_4_;
}

Assistant:

int DmgFactors::Apply(FName type, int damage)
{
	auto pdf = CheckKey(type);
	if (pdf == NULL && type != NAME_None)
	{
		pdf = CheckKey(NAME_None);
	}
	if (!pdf) return damage;
	return int(damage * *pdf);
}